

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::Clear(ImFont *this)

{
  this->FontSize = 0.0;
  (this->DisplayOffset).x = 0.0;
  (this->DisplayOffset).y = 1.0;
  *(undefined8 *)&this->ConfigDataCount = 0;
  *(undefined8 *)((long)&this->ConfigData + 6) = 0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  ImVector<ImFont::Glyph>::clear(&this->Glyphs);
  this->FallbackGlyph = (Glyph *)0x0;
  this->FallbackXAdvance = 0.0;
  ImVector<float>::clear(&this->IndexXAdvance);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  return;
}

Assistant:

void    ImFont::Clear()
{
    FontSize = 0.0f;
    DisplayOffset = ImVec2(0.0f, 1.0f);
    ConfigData = NULL;
    ConfigDataCount = 0;
    Ascent = Descent = 0.0f;
    ContainerAtlas = NULL;
    Glyphs.clear();
    FallbackGlyph = NULL;
    FallbackXAdvance = 0.0f;
    IndexXAdvance.clear();
    IndexLookup.clear();
}